

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O1

void liblogger::LogManager::Add(shared_ptr<liblogger::ILogger> *Log)

{
  _Node *p_Var1;
  LogManagerScopedLock lock;
  
  LogMutex::Lock((LogMutex *)m_mutex);
  p_Var1 = std::__cxx11::
           list<std::shared_ptr<liblogger::ILogger>,std::allocator<std::shared_ptr<liblogger::ILogger>>>
           ::_M_create_node<std::shared_ptr<liblogger::ILogger>const&>
                     ((list<std::shared_ptr<liblogger::ILogger>,std::allocator<std::shared_ptr<liblogger::ILogger>>>
                       *)&m_loggers_abi_cxx11_,Log);
  std::__detail::_List_node_base::_M_hook(&p_Var1->super__List_node_base);
  DAT_001483c0 = DAT_001483c0 + 1;
  LogMutex::Unlock((LogMutex *)m_mutex);
  return;
}

Assistant:

void LogManager::Add(std::shared_ptr<ILogger> Log)
{
	LogManagerScopedLock lock = LogManagerScopedLock();
	m_loggers.push_back(Log);
	lock.Unlock();
#ifdef DEBUG
	std::string str = Log->GetName();
	Logger(LOGGER_DEBUG, "Added Logger: %s", str.c_str());
#endif
}